

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFCommon.cpp
# Opt level: O1

void glTFCommon::Util::EncodeBase64(uint8_t *in,size_t inLength,string *out)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  char cVar4;
  size_type sVar5;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = inLength + 2;
  sVar5 = out->_M_string_length;
  std::__cxx11::string::resize
            ((ulong)out,
             (char)sVar5 + (SUB161(auVar1 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0xfe) * '\x02');
  if (inLength != 0) {
    uVar2 = 2;
    do {
      (out->_M_dataplus)._M_p[sVar5] =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/="[in[uVar2 - 2] >> 2];
      uVar3 = (ulong)((in[uVar2 - 2] & 3) << 4);
      if (uVar2 - 1 < inLength) {
        (out->_M_dataplus)._M_p[sVar5 + 1] =
             "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/="
             [in[uVar2 - 1] >> 4 | uVar3];
        uVar3 = (ulong)((in[uVar2 - 1] & 0xf) << 2);
        if (inLength <= uVar2) {
          (out->_M_dataplus)._M_p[sVar5 + 2] =
               "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/="[uVar3];
          goto LAB_006e0541;
        }
        (out->_M_dataplus)._M_p[sVar5 + 2] =
             "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/="
             [in[uVar2] >> 6 | uVar3];
        cVar4 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/="
                [in[uVar2] & 0x3f];
      }
      else {
        (out->_M_dataplus)._M_p[sVar5 + 1] =
             "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/="[uVar3];
        (out->_M_dataplus)._M_p[sVar5 + 2] = '=';
LAB_006e0541:
        cVar4 = '=';
      }
      (out->_M_dataplus)._M_p[sVar5 + 3] = cVar4;
      sVar5 = sVar5 + 4;
      uVar3 = uVar2 + 1;
      uVar2 = uVar2 + 3;
    } while (uVar3 < inLength);
  }
  return;
}

Assistant:

void EncodeBase64(const uint8_t* in, size_t inLength, std::string& out) {
    size_t outLength = ((inLength + 2) / 3) * 4;

    size_t j = out.size();
    out.resize(j + outLength);

    for (size_t i = 0; i < inLength; i += 3) {
        uint8_t b = (in[i] & 0xFC) >> 2;
        out[j++] = EncodeCharBase64(b);

        b = (in[i] & 0x03) << 4;
        if (i + 1 < inLength) {
            b |= (in[i + 1] & 0xF0) >> 4;
            out[j++] = EncodeCharBase64(b);

            b = (in[i + 1] & 0x0F) << 2;
            if (i + 2 < inLength) {
                b |= (in[i + 2] & 0xC0) >> 6;
                out[j++] = EncodeCharBase64(b);

                b = in[i + 2] & 0x3F;
                out[j++] = EncodeCharBase64(b);
            }
            else {
                out[j++] = EncodeCharBase64(b);
                out[j++] = '=';
            }
        }
        else {
            out[j++] = EncodeCharBase64(b);
            out[j++] = '=';
            out[j++] = '=';
        }
    }
}